

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interp.cc
# Opt level: O2

RunResult __thiscall
wabt::interp::Thread::
DoSimdDotAdd<wabt::interp::Simd<unsigned_int,(unsigned_char)4>,wabt::interp::Simd<short,(unsigned_char)8>>
          (Thread *this)

{
  long lVar1;
  undefined8 uStack_50;
  Simd<short,_(unsigned_char)__b_> lhs;
  Simd<short,_(unsigned_char)__b_> rhs;
  Simd<unsigned_int,_(unsigned_char)__x04_> result;
  Simd<unsigned_int,_(unsigned_char)__x04_> acc;
  
  uStack_50 = 0x15b3d1;
  Pop(this);
  uStack_50 = 0x15b3e3;
  rhs.v = (short  [8])Pop(this);
  uStack_50 = 0x15b3f5;
  lhs.v = (short  [8])Pop(this);
  for (lVar1 = 2; lVar1 != 0x12; lVar1 = lVar1 + 4) {
    *(int *)((long)rhs.v + lVar1 + 0xe) =
         (int)*(short *)((long)rhs.v + lVar1) * (int)*(short *)((long)lhs.v + lVar1) +
         (int)*(short *)((long)lhs.v + lVar1 + 0xe) * (int)*(short *)((long)lhs.v + lVar1 + -2) +
         *(int *)((long)result.v + lVar1 + 0xe);
  }
  uStack_50 = 0x15b442;
  Push(this,(Value)result.v);
  return Ok;
}

Assistant:

RunResult Thread::DoSimdDotAdd() {
  using SL = typename S::LaneType;
  auto acc = Pop<S>();
  auto rhs = Pop<T>();
  auto lhs = Pop<T>();
  S result;
  for (u8 i = 0; i < S::lanes; ++i) {
    u8 laneidx = i * 2;
    SL lo = SL(lhs[laneidx]) * SL(rhs[laneidx]);
    SL hi = SL(lhs[laneidx + 1]) * SL(rhs[laneidx + 1]);
    result[i] = Add(lo, hi);
    result[i] = Add(result[i], acc[i]);
  }
  Push(result);
  return RunResult::Ok;
}